

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  Context *context;
  Descriptor *this_01;
  ushort *puVar1;
  Printer *this_02;
  bool bVar2;
  ImmutableFieldGenerator *pIVar3;
  Nonnull<const_char_*> pcVar4;
  reference ppVar5;
  OneofGeneratorInfo *pOVar6;
  ClassNameResolver *this_03;
  undefined8 extraout_RAX;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *pDVar7;
  long v1;
  long v2;
  long lVar8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view begin_varname;
  string_view text_02;
  string_view text_03;
  const_iterator other;
  string_view text_04;
  iterator iVar9;
  string_view end_varname;
  string local_70;
  Printer *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  char *local_38;
  
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OrBuilder","");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar7,true,&local_70);
  pDVar7 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    pDVar7 = extraout_RDX_00;
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
    pDVar7 = extraout_RDX_01;
  }
  this_01 = (this->super_MessageGenerator).descriptor_;
  if (this_01->extension_range_count_ < 1) {
    local_38 = "@java.lang.Deprecated ";
    if ((this_01->options_->field_0)._impl_.deprecated_ == false) {
      local_38 = anon_var_dwarf_a12c75 + 5;
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_70,(java *)this_01,pDVar7);
    puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
    local_48._M_len = (size_t)*puVar1;
    local_48._M_str = (char *)((long)puVar1 + ~local_48._M_len);
    text_01._M_str =
         "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
    ;
    text_01._M_len = 0x83;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (printer,text_01,(char (*) [12])"deprecation",&local_38,
               (char (*) [17])"extra_interfaces",&local_70,(char (*) [10])0x134d25a,&local_48,
               (char (*) [2])0x122a33e,(char (*) [1])(anon_var_dwarf_a12c75 + 5),
               (char (*) [2])0x12347b2,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  }
  else {
    local_38 = "@java.lang.Deprecated ";
    if ((this_01->options_->field_0)._impl_.deprecated_ == false) {
      local_38 = anon_var_dwarf_a12c75 + 5;
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_70,(java *)this_01,pDVar7);
    puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
    local_48._M_len = (size_t)*puVar1;
    local_48._M_str = (char *)((long)puVar1 + ~local_48._M_len);
    text_00._M_str =
         "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage.\n        ExtendableMessageOrBuilder<$classname$> {\n"
    ;
    text_00._M_len = 0xb4;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (printer,text_00,(char (*) [12])"deprecation",&local_38,
               (char (*) [17])"extra_interfaces",&local_70,(char (*) [10])0x134d25a,&local_48,
               (char (*) [2])0x122a33e,(char (*) [1])(anon_var_dwarf_a12c75 + 5),
               (char (*) [2])0x12347b2,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,begin_varname,end_varname,(this->super_MessageGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if (0 < ((this->super_MessageGenerator).descriptor_)->field_count_) {
    lVar8 = 0;
    v1 = 0;
    do {
      text_02._M_str = "\n";
      text_02._M_len = 1;
      io::Printer::Print<>(printer,text_02);
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      v2 = (long)pDVar7->field_count_;
      if (v1 < v2) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,v2,"index < field_count()");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        GenerateInterface();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(&pDVar7->fields_->super_SymbolBase + lVar8));
      (*(pIVar3->super_FieldGenerator)._vptr_FieldGenerator[7])(pIVar3,printer);
      v1 = v1 + 1;
      lVar8 = lVar8 + 0x58;
    } while (v1 < ((this->super_MessageGenerator).descriptor_)->field_count_);
  }
  this_00 = &(this->super_MessageGenerator).oneofs_;
  local_50 = printer;
  iVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   *)this_00);
  local_48._M_len = (size_t)iVar9.node_;
  local_48._M_str = (char *)CONCAT44(local_48._M_str._4_4_,iVar9.position_);
  iVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                 *)this_00);
  bVar2 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                    *)&local_48,(const_iterator)iVar9);
  if (!bVar2) {
    do {
      ppVar5 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&local_48);
      pOVar6 = Context::GetOneofGeneratorInfo(this->context_,ppVar5->second);
      this_03 = Context::GetNameResolver(this->context_);
      ClassNameResolver::GetClassName_abi_cxx11_
                (&local_70,this_03,(this->super_MessageGenerator).descriptor_,true);
      text_03._M_str =
           "\n$classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n";
      text_03._M_len = 0x4d;
      io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
                (local_50,text_03,(char (*) [23])"oneof_capitalized_name",&pOVar6->capitalized_name,
                 (char (*) [10])0x134d25a,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)&local_48);
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     *)SUB128(iVar9._0_12_,0);
      other.position_ = SUB124(iVar9._0_12_,8);
      bVar2 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                        *)&local_48,other);
    } while (!bVar2);
  }
  this_02 = local_50;
  io::Printer::Outdent(local_50);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(this_02,text_04);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (const auto& kv : oneofs_) {
    printer->Print(
        "\n"
        "$classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(kv.second)->capitalized_name,
        "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}